

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
deqp::gles31::Functional::anon_unknown_1::generateRandomPatchTessLevels
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,int numPatches,
          int constantOuterLevelIndex,float constantOuterLevel,Random *rnd)

{
  pointer pfVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  allocator_type local_59;
  vector<float,_std::allocator<float>_> *local_58;
  int local_50;
  float local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = __return_storage_ptr__;
  local_4c = constantOuterLevel;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(ulong)(uint)(numPatches * 6),&local_59);
  local_38 = 0;
  local_48 = (ulong)(uint)numPatches;
  if (numPatches < 1) {
    local_48 = local_38;
  }
  local_50 = 2;
  for (local_40 = 0; local_40 != local_48; local_40 = local_40 + 1) {
    lVar4 = (long)local_50;
    iVar2 = (int)local_38;
    pfVar1 = (local_58->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fVar6 = deRandom_getFloat(&rnd->m_rnd);
      pfVar1[iVar2 + lVar3] = fVar6 * 61.0 + 1.0;
    }
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      fVar6 = local_4c;
      if ((uint)constantOuterLevelIndex != uVar5) {
        fVar6 = deRandom_getFloat(&rnd->m_rnd);
        fVar6 = fVar6 * 61.0 + 1.0;
      }
      pfVar1[lVar4 + uVar5] = fVar6;
    }
    local_38 = (ulong)((int)local_38 + 6);
    local_50 = local_50 + 6;
  }
  return local_58;
}

Assistant:

vector<float> generateRandomPatchTessLevels (int numPatches, int constantOuterLevelIndex, float constantOuterLevel, de::Random& rnd)
{
	vector<float> tessLevels(numPatches*6);

	for (int patchNdx = 0; patchNdx < numPatches; patchNdx++)
	{
		float* const inner = &tessLevels[patchNdx*6 + 0];
		float* const outer = &tessLevels[patchNdx*6 + 2];

		for (int j = 0; j < 2; j++)
			inner[j] = rnd.getFloat(1.0f, 62.0f);
		for (int j = 0; j < 4; j++)
			outer[j] = j == constantOuterLevelIndex ? constantOuterLevel : rnd.getFloat(1.0f, 62.0f);
	}

	return tessLevels;
}